

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramsurface.hpp
# Opt level: O3

void __thiscall ParamSurface::buildmesh(ParamSurface *this)

{
  undefined8 uVar1;
  vec2f vt1;
  vec2f vt3;
  vec2f vt3_00;
  vec2f vt2;
  vec2f vt1_00;
  Triangle *pTVar2;
  long lVar3;
  BasicContainer *this_00;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float fVar4;
  float fVar5;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  vec2f vt2_00;
  float fVar14;
  float fVar15;
  vec3f v1;
  vec3f v1_00;
  vec3f v2;
  vec3f v2_00;
  vec3f v3;
  vec3f v3_00;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> trigs;
  Triangle *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  float local_158;
  float fStack_154;
  float local_150;
  float fStack_14c;
  undefined8 local_148;
  undefined4 local_140;
  undefined8 local_138;
  undefined4 local_130;
  undefined8 local_128;
  undefined4 local_120;
  undefined8 local_118;
  undefined4 local_110;
  undefined8 local_108;
  undefined4 local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  float local_e8;
  float fStack_e4;
  float local_d8;
  float fStack_d4;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0.0;
  uStack_164 = 0;
  uStack_160 = 0;
  uStack_15c = 0;
  do {
    local_168 = local_168 + 0.01;
    fVar5 = 0.0;
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
    do {
      local_98 = 0;
      local_90 = 0;
      local_a8 = 0;
      local_a0 = 0;
      local_b8 = fVar5;
      uStack_b4 = uVar11;
      uStack_b0 = uVar12;
      uStack_ac = uVar13;
      (*(this->super_Primitive)._vptr_Primitive[3])((float)local_178,this,&local_98,&local_a8);
      fVar6 = local_b8 + 0.01;
      uStack_c4 = uStack_b4;
      uStack_c0 = uStack_b0;
      uStack_bc = uStack_ac;
      local_c8 = fVar6;
      local_68 = extraout_XMM0_Da;
      fStack_64 = extraout_XMM0_Db;
      (*(this->super_Primitive)._vptr_Primitive[3])((float)local_178,this,&local_98,&local_a8);
      fVar7 = local_b8;
      local_d8 = extraout_XMM0_Da_00;
      fStack_d4 = extraout_XMM0_Db_00;
      (*(this->super_Primitive)._vptr_Primitive[3])(local_168,this,&local_98,&local_a8);
      fVar8 = local_c8;
      local_e8 = extraout_XMM0_Da_01;
      fStack_e4 = extraout_XMM0_Db_01;
      (*(this->super_Primitive)._vptr_Primitive[3])(local_168,this,&local_98,&local_a8);
      fVar10 = (fStack_64 - fStack_d4) * (fVar5 - fVar7) - (fStack_64 - fStack_e4) * (fVar5 - fVar6)
      ;
      fVar9 = (fVar5 - fVar6) * (local_68 - local_e8) - (fVar5 - fVar7) * (local_68 - local_d8);
      fVar4 = (fStack_64 - fStack_e4) * (local_68 - local_d8) -
              (local_68 - local_e8) * (fStack_64 - fStack_d4);
      local_88 = local_168;
      fStack_84 = local_b8;
      uStack_80 = uStack_160;
      uStack_7c = uStack_15c;
      fVar14 = fStack_d4;
      fVar15 = fStack_e4;
      local_78 = extraout_XMM0_Da_02;
      fStack_74 = extraout_XMM0_Db_02;
      if (1e-12 < SQRT(fVar4 * fVar4 + fVar10 * fVar10 + fVar9 * fVar9)) {
        local_58 = fStack_e4;
        fStack_54 = fStack_e4;
        fStack_50 = fStack_e4;
        fStack_4c = fStack_e4;
        local_48 = fStack_d4;
        fStack_44 = fStack_d4;
        fStack_40 = fStack_d4;
        fStack_3c = fStack_d4;
        pTVar2 = (Triangle *)operator_new(0xa0);
        local_150 = (float)local_178;
        fStack_14c = local_c8;
        local_f8 = 0;
        local_f0 = 0;
        local_108 = 0;
        local_100 = 0;
        local_118 = 0;
        local_110 = 0;
        vt3_00.y = local_c8;
        vt3_00.x = (float)local_178;
        v1.y = fStack_64;
        v1.x = local_68;
        v2.y = fStack_e4;
        v2.x = local_e8;
        v3.y = fStack_d4;
        v3.x = local_d8;
        vt2.y = fStack_84;
        vt2.x = local_88;
        v1.z = fVar5;
        v2.z = fVar7;
        v3.z = fVar6;
        vt1.y = local_b8;
        vt1.x = (float)local_178;
        Triangle::Triangle(pTVar2,v1,v2,v3,vt1,vt2,vt3_00,(vec3f)(ZEXT412(0) << 0x40),
                           (vec3f)(ZEXT412(0) << 0x40),(vec3f)(ZEXT412(0) << 0x40));
        local_180 = pTVar2;
        if (trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
          _M_realloc_insert<BasicPrimitive*>
                    ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&trigs,
                     (iterator)
                     trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(BasicPrimitive **)&local_180);
        }
        else {
          *trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (BasicPrimitive *)pTVar2;
          trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
        lVar3 = __dynamic_cast(trigs.
                               super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1],
                               &BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
        uVar1 = *(undefined8 *)(lVar3 + 0x8c);
        *(undefined8 *)(lVar3 + 0x44) = uVar1;
        uVar11 = *(undefined4 *)(lVar3 + 0x94);
        *(undefined4 *)(lVar3 + 0x4c) = uVar11;
        *(undefined8 *)(lVar3 + 0x38) = uVar1;
        *(undefined4 *)(lVar3 + 0x40) = uVar11;
        *(undefined8 *)(lVar3 + 0x2c) = uVar1;
        *(undefined4 *)(lVar3 + 0x34) = uVar11;
        fVar14 = local_48;
        fVar15 = local_58;
      }
      fVar9 = (fStack_74 - fVar14) * (fVar8 - fVar7) - (fStack_74 - fVar15) * (fVar8 - fVar6);
      fVar4 = (fVar8 - fVar6) * (local_78 - local_e8) - (fVar8 - fVar7) * (local_78 - local_d8);
      fVar5 = (fStack_74 - fVar15) * (local_78 - local_d8) -
              (local_78 - local_e8) * (fStack_74 - fVar14);
      if (1e-12 < SQRT(fVar5 * fVar5 + fVar9 * fVar9 + fVar4 * fVar4)) {
        pTVar2 = (Triangle *)operator_new(0xa0);
        vt2_00.y = local_c8;
        vt2_00.x = local_168;
        local_158 = (float)local_178;
        fStack_154 = local_c8;
        local_128 = 0;
        local_120 = 0;
        local_138 = 0;
        local_130 = 0;
        local_148 = 0;
        local_140 = 0;
        vt3.y = local_c8;
        vt3.x = (float)local_178;
        v1_00.y = fStack_e4;
        v1_00.x = local_e8;
        v2_00.y = fStack_74;
        v2_00.x = local_78;
        v3_00.y = fStack_d4;
        v3_00.x = local_d8;
        vt1_00.y = fStack_84;
        vt1_00.x = local_88;
        v1_00.z = fVar7;
        v2_00.z = fVar8;
        v3_00.z = fVar6;
        Triangle::Triangle(pTVar2,v1_00,v2_00,v3_00,vt1_00,vt2_00,vt3,(vec3f)(ZEXT412(0) << 0x40),
                           (vec3f)(ZEXT412(0) << 0x40),(vec3f)(ZEXT412(0) << 0x40));
        local_180 = pTVar2;
        if (trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
          _M_realloc_insert<BasicPrimitive*>
                    ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&trigs,
                     (iterator)
                     trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(BasicPrimitive **)&local_180);
        }
        else {
          *trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (BasicPrimitive *)pTVar2;
          trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
        lVar3 = __dynamic_cast(trigs.
                               super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1],
                               &BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
        uVar1 = *(undefined8 *)(lVar3 + 0x8c);
        *(undefined8 *)(lVar3 + 0x44) = uVar1;
        uVar11 = *(undefined4 *)(lVar3 + 0x94);
        *(undefined4 *)(lVar3 + 0x4c) = uVar11;
        *(undefined8 *)(lVar3 + 0x38) = uVar1;
        *(undefined4 *)(lVar3 + 0x40) = uVar11;
        *(undefined8 *)(lVar3 + 0x2c) = uVar1;
        *(undefined4 *)(lVar3 + 0x34) = uVar11;
      }
      fVar5 = local_c8;
      uVar11 = uStack_c4;
      uVar12 = uStack_c0;
      uVar13 = uStack_bc;
    } while (local_c8 + 0.005 < 1.0);
    local_178 = CONCAT44(uStack_164,local_168);
    uStack_170 = CONCAT44(uStack_15c,uStack_160);
  } while (local_168 + 0.005 < 1.0);
  this_00 = (BasicContainer *)operator_new(0x40);
  BasicContainer::BasicContainer(this_00,&trigs);
  this->mesh = this_00;
  if (trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)trigs.
                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)trigs.
                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void buildmesh()
	{
		// build approximating mesh
		float step = 0.01;
		std::vector<BasicPrimitive*> trigs;
		for (float i=0; i+step/2<1; i+=step)
			for (float j=0; j+step/2<1; j+=step)
			{
				vec3f t1,t2,t; // dummy vars
				vec3f p00 = surface(i,j,t1,t2);
				vec3f p01 = surface(i,j+step,t1,t2);
				vec3f p10 = surface(i+step,j,t1,t2);
				vec3f p11 = surface(i+step,j+step,t1,t2);
				vec2f u00 = vec2f(i,j);
				vec2f u01 = vec2f(i,j+step);
				vec2f u10 = vec2f(i+step,j);
				vec2f u11 = vec2f(i+step,j+step);
				if (norm(cross(p00-p01,p00-p10)) > 1e-12)
				trigs.push_back(new Triangle(p00,p10,p01,u00,u10,u01,t,t,t));
				if (norm(cross(p00-p01,p00-p10)) > 1e-12)
				dynamic_cast<Triangle*>(trigs.back())->recompute_normal();
				if (norm(cross(p11-p01,p11-p10)) > 1e-12)
				trigs.push_back(new Triangle(p10,p11,p01,u10,u11,u01,t,t,t));
				if (norm(cross(p11-p01,p11-p10)) > 1e-12)
				dynamic_cast<Triangle*>(trigs.back())->recompute_normal();
			}
		mesh = new BasicContainer(trigs);
	}